

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# borg6.c
# Opt level: O1

_Bool borg_has_throwable(void)

{
  _Bool _Var1;
  uint uVar2;
  long lVar3;
  ulong uVar4;
  _Bool _Var5;
  
  uVar2 = (uint)z_info->pack_size;
  _Var5 = true;
  lVar3 = 0xa6;
  uVar4 = 0;
  while (((uVar4 == uVar2 || (borg_items->desc[lVar3 + -0x42] == '\0')) ||
         (_Var1 = flag_has_dbg((bitflag *)(borg_items->desc + lVar3),5,0x25,"borg_items[i].flags",
                               "OF_THROWING"), !_Var1))) {
    uVar4 = uVar4 + 1;
    uVar2 = (uint)z_info->pack_size;
    lVar3 = lVar3 + 0x388;
    _Var5 = uVar4 < z_info->quiver_size + uVar2 + 0xc;
    if (!_Var5) {
      return _Var5;
    }
  }
  return _Var5;
}

Assistant:

static bool borg_has_throwable(void)
{
    int i;
    for (i = 0; i < QUIVER_END; i++) {
        /* it will show wield in the list */
        /* but not if that is the only thing */
        if (i == INVEN_WIELD)
            continue;

        if (!borg_items[i].iqty)
            continue;

        if (of_has(borg_items[i].flags, OF_THROWING))
            return true;
    }
    return false;
}